

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

CURLcode Curl_parse_interface(char *input,char **dev,char **iface,char **host)

{
  int iVar1;
  size_t length;
  char *pcVar2;
  void *pvVar3;
  char *pcVar4;
  CURLcode CVar5;
  
  length = strlen(input);
  if (0x200 < length) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  iVar1 = strncmp("if!",input,3);
  if (iVar1 == 0) {
    if (input[3] == '\0') {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    pcVar2 = (char *)Curl_memdup0(input + 3,length - 3);
    *iface = pcVar2;
  }
  else {
    iVar1 = strncmp("host!",input,5);
    if (iVar1 == 0) {
      if (input[5] == '\0') {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      pcVar2 = (char *)Curl_memdup0(input + 5,length - 5);
      *host = pcVar2;
    }
    else {
      iVar1 = strncmp("ifhost!",input,7);
      if (iVar1 == 0) {
        pcVar2 = input + 7;
        pvVar3 = memchr(pcVar2,0x21,length - 7);
        if (pvVar3 == (void *)0x0) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        if (*(char *)((long)pvVar3 + 1) == '\0') {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        pcVar4 = (char *)Curl_memdup0(pcVar2,(long)pvVar3 - (long)pcVar2);
        *iface = pcVar4;
        if (pcVar4 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar2 = (char *)Curl_memdup0((char *)((long)pvVar3 + 1),
                                      (size_t)(pcVar2 + ((length - 7) - ((long)pvVar3 + 1))));
        *host = pcVar2;
        if (pcVar2 != (char *)0x0) {
          return CURLE_OK;
        }
        (*Curl_cfree)(*iface);
        *iface = (char *)0x0;
        return CURLE_OUT_OF_MEMORY;
      }
      if (*input == '\0') {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      pcVar2 = (char *)Curl_memdup0(input,length);
      *dev = pcVar2;
    }
  }
  CVar5 = CURLE_OUT_OF_MEMORY;
  if (pcVar2 != (char *)0x0) {
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_parse_interface(const char *input,
                              char **dev, char **iface, char **host)
{
  static const char if_prefix[] = "if!";
  static const char host_prefix[] = "host!";
  static const char if_host_prefix[] = "ifhost!";
  size_t len;

  DEBUGASSERT(dev);
  DEBUGASSERT(iface);
  DEBUGASSERT(host);

  len = strlen(input);
  if(len > 512)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(!strncmp(if_prefix, input, strlen(if_prefix))) {
    input += strlen(if_prefix);
    if(!*input)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    *iface = Curl_memdup0(input, len - strlen(if_prefix));
    return *iface ? CURLE_OK : CURLE_OUT_OF_MEMORY;
  }
  else if(!strncmp(host_prefix, input, strlen(host_prefix))) {
    input += strlen(host_prefix);
    if(!*input)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    *host = Curl_memdup0(input, len - strlen(host_prefix));
    return *host ? CURLE_OK : CURLE_OUT_OF_MEMORY;
  }
  else if(!strncmp(if_host_prefix, input, strlen(if_host_prefix))) {
    const char *host_part;
    input += strlen(if_host_prefix);
    len -= strlen(if_host_prefix);
    host_part = memchr(input, '!', len);
    if(!host_part || !*(host_part + 1))
      return CURLE_BAD_FUNCTION_ARGUMENT;
    *iface = Curl_memdup0(input, host_part - input);
    if(!*iface)
      return CURLE_OUT_OF_MEMORY;
    ++host_part;
    *host = Curl_memdup0(host_part, len - (host_part - input));
    if(!*host) {
      free(*iface);
      *iface = NULL;
      return CURLE_OUT_OF_MEMORY;
    }
    return CURLE_OK;
  }

  if(!*input)
    return CURLE_BAD_FUNCTION_ARGUMENT;
  *dev = Curl_memdup0(input, len);
  return *dev ? CURLE_OK : CURLE_OUT_OF_MEMORY;
}